

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_dump_dotgraph.c
# Opt level: O3

void linkedlist_dump_dotgraph
               (s_linkedlist *linked_list,_func_char_ptr_void_ptr *fun_render_node_element,
               int file_desc)

{
  int iVar1;
  char *__ptr;
  s_linkedlist_node *psVar2;
  char *local_38;
  char *buffer;
  
  psVar2 = linked_list->head;
  local_38 = (char *)0x0;
  write(file_desc,"digraph linkedlist {\n",0x15);
  if (psVar2 != (s_linkedlist_node *)0x0) {
    do {
      if (fun_render_node_element == (_func_char_ptr_void_ptr *)0x0) {
        iVar1 = asprintf(&local_38,"\"%p\" [shape=box label=\"<%p>\n\n%p\"];\n",psVar2,psVar2);
        write(file_desc,local_38,(long)iVar1);
        __ptr = local_38;
LAB_001027a5:
        free(__ptr);
      }
      else {
        __ptr = (*fun_render_node_element)(psVar2->element);
        iVar1 = asprintf(&local_38,"\"%p\" [shape=box label=\"<%p>\n\n%s\"];\n",psVar2,psVar2,__ptr)
        ;
        write(file_desc,local_38,(long)iVar1);
        free(local_38);
        if (__ptr != (char *)0x0) goto LAB_001027a5;
      }
      if (psVar2->previous != (s_linkedlist_node *)0x0) {
        iVar1 = asprintf(&local_38,"\"%p\" -> \"%p\";\n",psVar2);
        write(file_desc,local_38,(long)iVar1);
        free(local_38);
      }
      if (psVar2->next == (s_linkedlist_node *)0x0) break;
      iVar1 = asprintf(&local_38,"\"%p\" -> \"%p\";\n",psVar2);
      write(file_desc,local_38,(long)iVar1);
      free(local_38);
      psVar2 = psVar2->next;
    } while (psVar2 != (s_linkedlist_node *)0x0);
  }
  write(file_desc,"}\n",2);
  return;
}

Assistant:

void linkedlist_dump_dotgraph(s_linkedlist *linked_list, char *(*fun_render_node_element)(void *), int file_desc) {
    s_linkedlist_node *node   = linked_list->head;
    char              *buffer = NULL;
    int               len     = 0;

    write(file_desc, "digraph linkedlist {\n", 21);
    while (node != NULL) {
        if (fun_render_node_element != NULL) {
            char *element = fun_render_node_element(node->element);
            len = asprintf(&buffer, "\"%p\" [shape=box label=\"<%p>\n\n%s\"];\n", node, node, element);
            write(file_desc, buffer, len);

            free(buffer);
            if (element != NULL) {
                free(element);
            }
        } else {
            len = asprintf(&buffer, "\"%p\" [shape=box label=\"<%p>\n\n%p\"];\n", node, node, node->element);
            write(file_desc, buffer, len);

            free(buffer);
        }

        if (node->previous != NULL) {
            len = asprintf(&buffer, "\"%p\" -> \"%p\";\n", node, node->previous);
            write(file_desc, buffer, len);

            free(buffer);
        }

        if (node->next != NULL) {
            len = asprintf(&buffer, "\"%p\" -> \"%p\";\n", node, node->next);
            write(file_desc, buffer, len);

            free(buffer);
        }

        node = node->next;
    }

    write(file_desc, "}\n", 2);
}